

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbMfs.c
# Opt level: O0

int Acb_NtkFindSupp2(Acb_Ntk_t *p,int Pivot,sat_solver *pSat,int nVars,int nDivs,Vec_Int_t *vWin,
                    Vec_Int_t *vSupp,int nLutSize,int fDelay)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  int *piVar5;
  int *end;
  int *pFanins2_1;
  int local_68;
  int iFanin2_1;
  int k2_1;
  int nNonCrits;
  int *pFanins2;
  int iFanin2;
  int k2;
  int *pFanins;
  int iFanin;
  int k;
  int status;
  int nSuppNew;
  Vec_Int_t *vWin_local;
  int nDivs_local;
  int nVars_local;
  sat_solver *pSat_local;
  int Pivot_local;
  Acb_Ntk_t *p_local;
  
  pFanins._4_4_ = 0;
  piVar4 = Acb_ObjFanins(p,Pivot);
  for (; pFanins._4_4_ < *piVar4; pFanins._4_4_ = pFanins._4_4_ + 1) {
    iVar1 = piVar4[pFanins._4_4_ + 1];
    iVar3 = Acb_ObjFunc(p,iVar1);
    if ((iVar3 < 0) || (iVar1 = Acb_ObjFunc(p,iVar1), nDivs <= iVar1)) {
      __assert_fail("Acb_ObjFunc(p, iFanin) >= 0 && Acb_ObjFunc(p, iFanin) < nDivs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acbMfs.c"
                    ,0x3ab,
                    "int Acb_NtkFindSupp2(Acb_Ntk_t *, int, sat_solver *, int, int, Vec_Int_t *, Vec_Int_t *, int, int)"
                   );
    }
  }
  if (fDelay == 0) {
    pFanins._4_4_ = 0;
    piVar4 = Acb_ObjFanins(p,Pivot);
    for (; pFanins._4_4_ < *piVar4; pFanins._4_4_ = pFanins._4_4_ + 1) {
      iVar1 = piVar4[pFanins._4_4_ + 1];
      iVar3 = Acb_ObjIsAreaCritical(p,iVar1);
      if (iVar3 != 0) {
        Vec_IntClear(vSupp);
        pFanins2._4_4_ = 0;
        piVar5 = Acb_ObjFanins(p,Pivot);
        for (; pFanins2._4_4_ < *piVar5; pFanins2._4_4_ = pFanins2._4_4_ + 1) {
          if (iVar1 != piVar5[pFanins2._4_4_ + 1]) {
            Vec_IntPush(vSupp,piVar5[pFanins2._4_4_ + 1]);
          }
        }
        pFanins2._4_4_ = 0;
        piVar5 = Acb_ObjFanins(p,iVar1);
        for (; pFanins2._4_4_ < *piVar5; pFanins2._4_4_ = pFanins2._4_4_ + 1) {
          Vec_IntPushUnique(vSupp,piVar5[pFanins2._4_4_ + 1]);
        }
        piVar5 = Vec_IntArray(vSupp);
        iVar1 = Vec_IntSize(vSupp);
        Vec_IntSelectSortCost(piVar5,iVar1,&p->vLevelD);
        Acb_NtkRemapIntoSatVariables(p,vSupp);
        Vec_IntVars2Lits(vSupp,nVars << 1,0);
        piVar5 = Vec_IntArray(vSupp);
        end = Vec_IntLimit(vSupp);
        iVar1 = sat_solver_solve(pSat,piVar5,end,0,0,0,0);
        if (iVar1 != -1) {
          printf("Failed internal check at node %d.\n",(ulong)(uint)Pivot);
          __assert_fail("status == l_False",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acbMfs.c"
                        ,0x3e5,
                        "int Acb_NtkFindSupp2(Acb_Ntk_t *, int, sat_solver *, int, int, Vec_Int_t *, Vec_Int_t *, int, int)"
                       );
        }
        piVar5 = Vec_IntArray(vSupp);
        iVar1 = Vec_IntSize(vSupp);
        iVar1 = sat_solver_minimize_assumptions(pSat,piVar5,iVar1,0);
        Vec_IntShrink(vSupp,iVar1);
        Vec_IntLits2Vars(vSupp,nVars * -2);
        iVar1 = Vec_IntSize(vSupp);
        if (iVar1 <= nLutSize) {
          return 1;
        }
      }
    }
    p_local._4_4_ = 0;
  }
  else {
    iVar1 = Acb_ObjLevelD(p,Pivot);
    if (iVar1 < 2) {
      __assert_fail("Acb_ObjLevelD( p, Pivot ) > 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acbMfs.c"
                    ,0x3b0,
                    "int Acb_NtkFindSupp2(Acb_Ntk_t *, int, sat_solver *, int, int, Vec_Int_t *, Vec_Int_t *, int, int)"
                   );
    }
    Vec_IntClear(vSupp);
    pFanins._4_4_ = 0;
    piVar4 = Acb_ObjFanins(p,Pivot);
    for (; pFanins._4_4_ < *piVar4; pFanins._4_4_ = pFanins._4_4_ + 1) {
      iVar1 = piVar4[pFanins._4_4_ + 1];
      iVar3 = Acb_ObjIsDelayCriticalFanin(p,Pivot,iVar1);
      if (iVar3 == 0) {
        Vec_IntPush(vSupp,iVar1);
      }
    }
    iVar1 = Vec_IntSize(vSupp);
    pFanins._4_4_ = 0;
    piVar4 = Acb_ObjFanins(p,Pivot);
    for (; pFanins._4_4_ < *piVar4; pFanins._4_4_ = pFanins._4_4_ + 1) {
      iVar3 = piVar4[pFanins._4_4_ + 1];
      iVar2 = Acb_ObjIsDelayCriticalFanin(p,Pivot,iVar3);
      if (iVar2 != 0) {
        local_68 = 0;
        piVar5 = Acb_ObjFanins(p,iVar3);
        for (; local_68 < *piVar5; local_68 = local_68 + 1) {
          Vec_IntPushUnique(vSupp,piVar5[local_68 + 1]);
        }
      }
    }
    iVar3 = Vec_IntSize(vSupp);
    if (iVar3 <= iVar1) {
      __assert_fail("nNonCrits < Vec_IntSize(vSupp)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acbMfs.c"
                    ,0x3bb,
                    "int Acb_NtkFindSupp2(Acb_Ntk_t *, int, sat_solver *, int, int, Vec_Int_t *, Vec_Int_t *, int, int)"
                   );
    }
    piVar4 = Vec_IntArray(vSupp);
    iVar3 = Vec_IntSize(vSupp);
    Vec_IntSelectSortCost(piVar4 + iVar1,iVar3 - iVar1,&p->vLevelD);
    for (pFanins._4_4_ = 0; iVar1 = Vec_IntSize(vSupp), pFanins._4_4_ < iVar1;
        pFanins._4_4_ = pFanins._4_4_ + 1) {
      iVar1 = Vec_IntEntry(vSupp,pFanins._4_4_);
      iVar3 = Acb_ObjFunc(p,iVar1);
      if (iVar3 < 0) {
        __assert_fail("Acb_ObjFunc(p, iFanin) >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acbMfs.c"
                      ,0x3c1,
                      "int Acb_NtkFindSupp2(Acb_Ntk_t *, int, sat_solver *, int, int, Vec_Int_t *, Vec_Int_t *, int, int)"
                     );
      }
      iVar1 = Acb_ObjFunc(p,iVar1);
      Vec_IntWriteEntry(vSupp,pFanins._4_4_,iVar1);
    }
    Vec_IntVars2Lits(vSupp,nVars << 1,0);
    piVar4 = Vec_IntArray(vSupp);
    piVar5 = Vec_IntLimit(vSupp);
    iVar1 = sat_solver_solve(pSat,piVar4,piVar5,0,0,0,0);
    if (iVar1 != -1) {
      printf("Failed internal check at node %d.\n",(ulong)(uint)Pivot);
      __assert_fail("status == l_False",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acbMfs.c"
                    ,0x3c9,
                    "int Acb_NtkFindSupp2(Acb_Ntk_t *, int, sat_solver *, int, int, Vec_Int_t *, Vec_Int_t *, int, int)"
                   );
    }
    piVar4 = Vec_IntArray(vSupp);
    iVar1 = Vec_IntSize(vSupp);
    iVar1 = sat_solver_minimize_assumptions(pSat,piVar4,iVar1,0);
    Vec_IntShrink(vSupp,iVar1);
    Vec_IntLits2Vars(vSupp,nVars * -2);
    iVar1 = Vec_IntSize(vSupp);
    p_local._4_4_ = (uint)(iVar1 <= nLutSize);
  }
  return p_local._4_4_;
}

Assistant:

int Acb_NtkFindSupp2( Acb_Ntk_t * p, int Pivot, sat_solver * pSat, int nVars, int nDivs, Vec_Int_t * vWin, Vec_Int_t * vSupp, int nLutSize, int fDelay )
{
    int nSuppNew, status, k, iFanin, * pFanins, k2, iFanin2, * pFanins2;
    Acb_ObjForEachFaninFast( p, Pivot, pFanins, iFanin, k )
        assert( Acb_ObjFunc(p, iFanin) >= 0 && Acb_ObjFunc(p, iFanin) < nDivs );
    if ( fDelay )
    {
        // add non-timing-critical fanins
        int nNonCrits, k2, iFanin2 = 0, * pFanins2;
        assert( Acb_ObjLevelD( p, Pivot ) > 1 );
        Vec_IntClear( vSupp );
        Acb_ObjForEachFaninFast( p, Pivot, pFanins, iFanin, k )
            if ( !Acb_ObjIsDelayCriticalFanin( p, Pivot, iFanin ) )
                Vec_IntPush( vSupp, iFanin );
        nNonCrits = Vec_IntSize(vSupp);
        // add fanins of timing critical fanins
        Acb_ObjForEachFaninFast( p, Pivot, pFanins, iFanin, k )
            if ( Acb_ObjIsDelayCriticalFanin( p, Pivot, iFanin ) )
                Acb_ObjForEachFaninFast( p, iFanin, pFanins2, iFanin2, k2 )
                    Vec_IntPushUnique( vSupp, iFanin2 );
        assert( nNonCrits < Vec_IntSize(vSupp) );
        // sort additional fanins by level
        Vec_IntSelectSortCost( Vec_IntArray(vSupp) + nNonCrits, Vec_IntSize(vSupp) - nNonCrits, &p->vLevelD );
        // translate to SAT vars
        Vec_IntForEachEntry( vSupp, iFanin, k )
        {
            assert( Acb_ObjFunc(p, iFanin) >= 0 );
            Vec_IntWriteEntry( vSupp, k, Acb_ObjFunc(p, iFanin) );
        }
        // solve for these fanins
        Vec_IntVars2Lits( vSupp, 2*nVars, 0 );
        status = sat_solver_solve( pSat, Vec_IntArray(vSupp), Vec_IntLimit(vSupp), 0, 0, 0, 0 );
        if ( status != l_False )
            printf( "Failed internal check at node %d.\n", Pivot );
        assert( status == l_False );
        nSuppNew = sat_solver_minimize_assumptions( pSat, Vec_IntArray(vSupp), Vec_IntSize(vSupp), 0 );
        Vec_IntShrink( vSupp, nSuppNew );
        Vec_IntLits2Vars( vSupp, -2*nVars );
        return Vec_IntSize(vSupp) <= nLutSize;
    }
    // iterate through different fanout free cones
    Acb_ObjForEachFaninFast( p, Pivot, pFanins, iFanin, k )
    {
        if ( !Acb_ObjIsAreaCritical(p, iFanin) )
            continue;
        // collect fanins of the root node
        Vec_IntClear( vSupp );
        Acb_ObjForEachFaninFast( p, Pivot, pFanins2, iFanin2, k2 )
            if ( iFanin != iFanin2 )
                Vec_IntPush( vSupp, iFanin2 );
        // collect fanins of the selected node
        Acb_ObjForEachFaninFast( p, iFanin, pFanins2, iFanin2, k2 )
            Vec_IntPushUnique( vSupp, iFanin2 );
        // sort fanins by level
        Vec_IntSelectSortCost( Vec_IntArray(vSupp), Vec_IntSize(vSupp), &p->vLevelD );
        //Acb_NtkOrderByRefCount( p, vSupp );
        Acb_NtkRemapIntoSatVariables( p, vSupp );
        // solve for these fanins
        Vec_IntVars2Lits( vSupp, 2*nVars, 0 );
        status = sat_solver_solve( pSat, Vec_IntArray(vSupp), Vec_IntLimit(vSupp), 0, 0, 0, 0 );
        if ( status != l_False )
            printf( "Failed internal check at node %d.\n", Pivot );
        assert( status == l_False );
        nSuppNew = sat_solver_minimize_assumptions( pSat, Vec_IntArray(vSupp), Vec_IntSize(vSupp), 0 );
        Vec_IntShrink( vSupp, nSuppNew );
        Vec_IntLits2Vars( vSupp, -2*nVars );
        if ( Vec_IntSize(vSupp) <= nLutSize )
            return 1;
    }
    return 0;
}